

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O2

void aom_highbd_minmax_8x8_c(uint8_t *s8,int p,uint8_t *d8,int dp,int *min,int *max)

{
  ushort uVar1;
  long lVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  lVar6 = (long)s8 * 2;
  lVar2 = (long)d8 * 2;
  *min = 0xffff;
  *max = 0;
  for (iVar5 = 0; iVar5 != 8; iVar5 = iVar5 + 1) {
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      iVar8 = (uint)*(ushort *)(lVar6 + lVar7 * 2) - (uint)*(ushort *)(lVar2 + lVar7 * 2);
      uVar1 = (ushort)iVar8;
      uVar3 = -uVar1;
      if (0 < iVar8) {
        uVar3 = uVar1;
      }
      uVar4 = *min;
      if ((int)(uint)uVar3 < *min) {
        uVar4 = (uint)uVar3;
      }
      *min = uVar4;
      uVar4 = *max;
      if (*max < (int)(uint)uVar3) {
        uVar4 = (uint)uVar3;
      }
      *max = uVar4;
    }
    lVar2 = lVar2 + (long)dp * 2;
    lVar6 = lVar6 + (long)p * 2;
  }
  return;
}

Assistant:

void aom_highbd_minmax_8x8_c(const uint8_t *s8, int p, const uint8_t *d8,
                             int dp, int *min, int *max) {
  int i, j;
  const uint16_t *s = CONVERT_TO_SHORTPTR(s8);
  const uint16_t *d = CONVERT_TO_SHORTPTR(d8);
  *min = 65535;
  *max = 0;
  for (i = 0; i < 8; ++i, s += p, d += dp) {
    for (j = 0; j < 8; ++j) {
      int diff = abs(s[j] - d[j]);
      *min = diff < *min ? diff : *min;
      *max = diff > *max ? diff : *max;
    }
  }
}